

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vic20.cpp
# Opt level: O0

void __thiscall
Commodore::Vic20::Joystick::Joystick
          (Joystick *this,UserPortVIA *user_port_via_port_handler,
          KeyboardVIA *keyboard_via_port_handler)

{
  initializer_list<Inputs::Joystick::Input> __l;
  allocator<Inputs::Joystick::Input> local_99;
  Input local_98;
  Input local_88;
  Input local_78;
  Input local_68;
  Input local_58;
  Input *local_48;
  size_type local_40;
  vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> local_38;
  KeyboardVIA *local_20;
  KeyboardVIA *keyboard_via_port_handler_local;
  UserPortVIA *user_port_via_port_handler_local;
  Joystick *this_local;
  
  local_20 = keyboard_via_port_handler;
  keyboard_via_port_handler_local = (KeyboardVIA *)user_port_via_port_handler;
  user_port_via_port_handler_local = (UserPortVIA *)this;
  Inputs::Joystick::Input::Input(&local_98,Up,0);
  Inputs::Joystick::Input::Input(&local_88,Down,0);
  Inputs::Joystick::Input::Input(&local_78,Left,0);
  Inputs::Joystick::Input::Input(&local_68,Right,0);
  Inputs::Joystick::Input::Input(&local_58,Fire,0);
  local_40 = 5;
  local_48 = &local_98;
  std::allocator<Inputs::Joystick::Input>::allocator(&local_99);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::vector
            (&local_38,__l,&local_99);
  Inputs::ConcreteJoystick::ConcreteJoystick(&this->super_ConcreteJoystick,&local_38);
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::~vector(&local_38)
  ;
  std::allocator<Inputs::Joystick::Input>::~allocator(&local_99);
  (this->super_ConcreteJoystick).super_Joystick._vptr_Joystick =
       (_func_int **)&PTR__Joystick_00c9f1c8;
  this->user_port_via_port_handler_ = (UserPortVIA *)keyboard_via_port_handler_local;
  this->keyboard_via_port_handler_ = local_20;
  return;
}

Assistant:

Joystick(UserPortVIA &user_port_via_port_handler, KeyboardVIA &keyboard_via_port_handler) :
			ConcreteJoystick({
				Input(Input::Up),
				Input(Input::Down),
				Input(Input::Left),
				Input(Input::Right),
				Input(Input::Fire)
			}),
			user_port_via_port_handler_(user_port_via_port_handler),
			keyboard_via_port_handler_(keyboard_via_port_handler) {}